

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

string * __thiscall
DDSInfo::PrintDXGIFormatFlagNames_abi_cxx11_
          (string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 2) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 2) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 2) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 3)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 3) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 3) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 3) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 4)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 4) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 4) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 4) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 5)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 6) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 6) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 6) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 7)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 7) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 7) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 7) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 8)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 8) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 8) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 8) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 9)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 10) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 10) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 10) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0xb)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0xb) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0xb) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0xb) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0xc)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0xc) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0xc) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0xc) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0xd)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0xd) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0xd) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0xd) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0xe)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0xe) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0xe) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0xe) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0xf)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x10) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x10) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x10) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x11)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x11) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x11) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x11) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x12)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x12) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x12) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x12) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x13)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x18) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x18) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x18) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x19)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x19) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x19) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x19) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x1a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1a) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1a) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1a) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x1b)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1c) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1c) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1c) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x1d)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1d) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x1e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1e) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x1f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1f) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x20)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x20) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x20) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x20) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x21)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x22) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x22) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x22) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x23)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x23) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x23) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x23) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x24)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x24) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x24) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x24) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x25)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x25) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x25) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x25) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x26)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x26) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x26) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x26) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x27)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x29) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x29) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x29) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x2a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x2a) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x2a) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x2a) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x2b)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x2b) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x2b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x2b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x2c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x31) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x31) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x31) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x32)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x32) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x32) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x32) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x33)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x33) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x33) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x33) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x34)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x34) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x34) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x34) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x35)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x36) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x36) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x36) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x37)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x38) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x38) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x38) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x39)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x39) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x39) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x39) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3a) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3a) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3a) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3b)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3b) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3c) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3c) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3c) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3d)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3d) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3e) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x3f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3f) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x40)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x40) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x40) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x40) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x41)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x41) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x41) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x41) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x42)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x42) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x42) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x42) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x43)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x43) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x43) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x43) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x44)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x44) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x44) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x44) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x45)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x45) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x45) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x45) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x46)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x47) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x47) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x47) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x48)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x48) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x48) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x48) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x49)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x4a) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x4a) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x4a) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x4b)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x4b) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x4b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x4b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x4c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x4d) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x4d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x4d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x4e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x4e) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x4e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x4e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x4f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x50) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x50) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x50) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x51)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x51) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x51) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x51) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x52)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x53) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x53) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x53) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x54)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x54) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x54) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x54) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x55)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x55) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x55) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x55) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x56)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x56) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x56) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x56) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x57)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x57) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x57) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x57) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x58)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x58) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x58) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x58) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x59)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x59) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x59) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x59) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x5a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x5b) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x5b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x5b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x5c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x5d) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x5d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x5d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x5e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x5f) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x5f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x5f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x60)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x60) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x60) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x60) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x61)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x62) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x62) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x62) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 99)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 99) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 99) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 99) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 100)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x6b) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x6b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x6b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x6c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x6f) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x6f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x6f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x70)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x70) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x70) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x70) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x71)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x73) != 0) {
    puVar2 = &DAT_00143508;
    if (DAT_00143510 != (undefined8 *)0x0) {
      puVar2 = &DAT_00143508;
      puVar1 = DAT_00143510;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x73) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x73) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_00143508;
    if ((puVar2 != &DAT_00143508) && (puVar1 = &DAT_00143508, *(uint *)(puVar2 + 4) < 0x74)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((int)this != 0) {
    puVar1 = &DAT_00143508;
    for (puVar2 = DAT_00143510; puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)puVar2[(ulong)(*(int *)(puVar2 + 4) != -1) + 2]) {
      if (*(int *)(puVar2 + 4) == -1) {
        puVar1 = puVar2;
      }
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  RemoveTrailingCharacter(__return_storage_ptr__,'|');
  return __return_storage_ptr__;
}

Assistant:

std::string PrintDXGIFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,dxgi_format_names)
    #include "defs/dds/dxgi_format.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }